

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makeIf(TranslateToFuzzReader *this,Type type)

{
  bool bVar1;
  Index IVar2;
  bool local_b1;
  ThreeArgs local_98;
  Type local_80;
  Type local_78;
  Type local_70;
  Type falseType;
  Type trueType;
  ThreeArgs local_50;
  BasicType local_34;
  Expression *local_30;
  Expression *ret;
  Expression *local_20;
  Expression *condition;
  TranslateToFuzzReader *this_local;
  Type type_local;
  
  condition = (Expression *)this;
  this_local = (TranslateToFuzzReader *)type.id;
  local_20 = makeCondition(this);
  ret = (Expression *)0x0;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
            (&this->funcContext->hangStack,&ret);
  local_34 = none;
  bVar1 = Type::operator==((Type *)&this_local,&local_34);
  local_b1 = false;
  if (bVar1) {
    local_b1 = oneIn(this,2);
  }
  if (local_b1 == false) {
    falseType.id = (uintptr_t)this_local;
    local_70.id = (uintptr_t)this_local;
    IVar2 = upTo(this,0x14);
    if (IVar2 == 0) {
      Type::Type(&local_78,unreachable);
      falseType.id = local_78.id;
    }
    else if (IVar2 == 1) {
      Type::Type(&local_80,unreachable);
      local_70.id = local_80.id;
    }
    local_98.a = local_20;
    local_98.b = makeMaybeBlock(this,falseType);
    local_98.c = makeMaybeBlock(this,local_70);
    local_30 = buildIf(this,&local_98,(Type)this_local);
  }
  else {
    local_50.a = local_20;
    local_50.b = makeMaybeBlock(this,(Type)this_local);
    local_50.c = (Expression *)0x0;
    local_30 = buildIf(this,&local_50,(Type)this_local);
  }
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::pop_back
            (&this->funcContext->hangStack);
  return local_30;
}

Assistant:

Expression* TranslateToFuzzReader::makeIf(Type type) {
  auto* condition = makeCondition();
  funcContext->hangStack.push_back(nullptr);

  Expression* ret;
  if (type == Type::none && oneIn(2)) {
    // Just an ifTrue arm.
    ret = buildIf({condition, makeMaybeBlock(type), nullptr}, type);
  } else {
    // Also an ifFalse arm.

    // Some of the time make one arm unreachable (but not both, as then the if
    // as a whole would be unreachable).
    auto trueType = type;
    auto falseType = type;
    switch (upTo(20)) {
      case 0:
        trueType = Type::unreachable;
        break;
      case 1:
        falseType = Type::unreachable;
        break;
    }
    ret = buildIf(
      {condition, makeMaybeBlock(trueType), makeMaybeBlock(falseType)}, type);
  }

  funcContext->hangStack.pop_back();
  return ret;
}